

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cclock.cpp
# Opt level: O2

bool __thiscall CCLock::TryEnter(CCLock *this)

{
  uint uVar1;
  
  uVar1 = pthread_mutex_trylock((pthread_mutex_t *)this);
  if (((uVar1 & 0xffffffef) != 0) && (*(long *)this->mutexPtr != 0)) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cclock.cpp"
            ,0x42,"err == 0 || err == 16 || *((size_t*)mutexPtr) == 0","Mutex TryEnter has failed");
    fflush(_stderr);
    abort();
  }
  return uVar1 != 0x10;
}

Assistant:

bool CCLock::TryEnter()
{
    pthread_mutex_t *mutex = (pthread_mutex_t*)this->mutexPtr;
    int err = pthread_mutex_trylock(mutex);
    AssertMsg(err == 0 || err == EBUSY || *((size_t*)mutexPtr) == 0, "Mutex TryEnter has failed");

    if (err != EBUSY)
    {
        return true;
    }
    return false;
}